

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O3

void keccak_digest(ssh_hash *hash,uchar *output)

{
  byte *pbVar1;
  ssh_hashalg *psVar2;
  size_t sVar3;
  long lVar4;
  ssh_hash *psVar5;
  long lVar6;
  uchar padding [200];
  undefined8 local_100;
  undefined8 local_f8 [25];
  
  local_100 = 0;
  psVar2 = (ssh_hashalg *)hash[-2].binarysink_;
  if (hash[-1].vt == (ssh_hashalg *)hash[-2].binarysink_) {
    psVar2 = (ssh_hashalg *)0x0;
  }
  sVar3 = (long)hash[-1].vt - (long)psVar2;
  memset(local_f8,0,sVar3);
  local_f8[0] = CONCAT71(local_f8[0]._1_7_,(byte)local_f8[0] | *(byte *)&hash[-2].vt);
  pbVar1 = (byte *)((long)local_f8 + (sVar3 - 1));
  *pbVar1 = *pbVar1 | 0x80;
  keccak_accumulate((keccak_state *)(hash + -0x1b),local_f8,sVar3);
  lVar6 = 0;
  psVar5 = hash;
  do {
    lVar4 = -0x1b0;
    do {
      sVar3 = (long)hash[-1].binarysink_ - lVar6;
      if (sVar3 == 0) break;
      if (7 < sVar3) {
        sVar3 = 8;
      }
      local_f8[0] = *(undefined8 *)((long)&psVar5->vt + lVar4);
      memcpy(output + lVar6,local_f8,sVar3);
      lVar6 = lVar6 + sVar3;
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != -0xe8);
    local_100 = local_100 + 1;
    psVar5 = (ssh_hash *)&psVar5->binarysink_;
    if (local_100 == 5) {
      return;
    }
  } while( true );
}

Assistant:

static void keccak_digest(ssh_hash *hash, unsigned char *output)
{
    struct keccak_hash *kh = container_of(hash, struct keccak_hash, hash);
    keccak_output(&kh->state, output);
}